

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

void __thiscall doctest::detail::ContextState::finalizeTestCaseData(ContextState *this)

{
  int *piVar1;
  double dVar2;
  uint uVar3;
  int iVar4;
  TestCase *pTVar5;
  int result_1;
  long lVar6;
  uint uVar7;
  int result;
  int iVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  timeval t;
  timeval local_28;
  
  iVar8 = 0;
  gettimeofday(&local_28,(__timezone_ptr_t)0x0);
  lVar6 = (local_28.tv_sec * 1000000 + local_28.tv_usec) - (this->timer).m_ticks;
  auVar9._8_4_ = (int)((ulong)lVar6 >> 0x20);
  auVar9._0_8_ = lVar6;
  auVar9._12_4_ = 0x45300000;
  (this->super_CurrentTestCaseStats).seconds =
       ((auVar9._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) / 1000000.0;
  lVar6 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar6 + -4)
    ;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  *(int *)&this->field_0x9c = *(int *)&this->field_0x9c + iVar8;
  iVar8 = 0;
  lVar6 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  *(int *)&this->field_0xa0 = *(int *)&this->field_0xa0 + iVar8;
  iVar8 = 0;
  lVar6 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsCurrentTest_atomic).m_atomics[0].padding + lVar6 + -4)
    ;
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsCurrentTest = iVar8;
  iVar8 = 0;
  lVar6 = 0;
  do {
    iVar8 = iVar8 + *(int *)((this->numAssertsFailedCurrentTest_atomic).m_atomics[0].padding +
                            lVar6 + -4);
    lVar6 = lVar6 + 0x40;
  } while (lVar6 != 0x800);
  (this->super_CurrentTestCaseStats).numAssertsFailedCurrentTest = iVar8;
  if (iVar8 != 0) {
    piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
    *(byte *)piVar1 = (byte)*piVar1 | 1;
  }
  pTVar5 = (this->super_ContextOptions).currentTest;
  dVar2 = (pTVar5->super_TestCaseData).m_timeout;
  dVar10 = ABS(dVar2);
  dVar12 = dVar10;
  if (dVar10 <= 0.0) {
    dVar12 = 0.0;
  }
  if (((dVar12 + 1.0) * 2.220446049250313e-16 <= ABS(0.0 - dVar2)) &&
     (dVar12 = (this->super_CurrentTestCaseStats).seconds, dVar2 < dVar12)) {
    dVar11 = ABS(dVar12);
    if (ABS(dVar12) <= dVar10) {
      dVar11 = dVar10;
    }
    if ((dVar11 + 1.0) * 2.220446049250313e-16 <= ABS(dVar2 - dVar12)) {
      piVar1 = &(this->super_CurrentTestCaseStats).failure_flags;
      *(byte *)piVar1 = (byte)*piVar1 | 0x10;
    }
  }
  uVar3 = (this->super_CurrentTestCaseStats).failure_flags;
  if ((pTVar5->super_TestCaseData).m_should_fail == true) {
    uVar7 = 0x20;
    if (uVar3 != 0) {
      uVar7 = uVar3 | 0x40;
    }
  }
  else if ((uVar3 == 0) || ((pTVar5->super_TestCaseData).m_may_fail != true)) {
    iVar4 = (pTVar5->super_TestCaseData).m_expected_failures;
    if (iVar4 < 1) goto LAB_00114e23;
    if (iVar8 == iVar4) {
      uVar7 = uVar3 | 0x100;
    }
    else {
      uVar7 = uVar3 | 0x80;
    }
  }
  else {
    uVar7 = uVar3 | 0x200;
  }
  (this->super_CurrentTestCaseStats).failure_flags = uVar7;
LAB_00114e23:
  uVar3 = (this->super_CurrentTestCaseStats).failure_flags;
  if (uVar3 != 0 && (uVar3 & 0x340) == 0) {
    *(int *)&this->field_0x98 = *(int *)&this->field_0x98 + 1;
  }
  return;
}

Assistant:

void finalizeTestCaseData() {
            seconds = timer.getElapsedSeconds();

            // update the non-atomic counters
            numAsserts += numAssertsCurrentTest_atomic;
            numAssertsFailed += numAssertsFailedCurrentTest_atomic;
            numAssertsCurrentTest       = numAssertsCurrentTest_atomic;
            numAssertsFailedCurrentTest = numAssertsFailedCurrentTest_atomic;

            if(numAssertsFailedCurrentTest)
                failure_flags |= TestCaseFailureReason::AssertFailure;

            if(Approx(currentTest->m_timeout).epsilon(DBL_EPSILON) != 0 &&
               Approx(seconds).epsilon(DBL_EPSILON) > currentTest->m_timeout)
                failure_flags |= TestCaseFailureReason::Timeout;

            if(currentTest->m_should_fail) {
                if(failure_flags) {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedAndDid;
                } else {
                    failure_flags |= TestCaseFailureReason::ShouldHaveFailedButDidnt;
                }
            } else if(failure_flags && currentTest->m_may_fail) {
                failure_flags |= TestCaseFailureReason::CouldHaveFailedAndDid;
            } else if(currentTest->m_expected_failures > 0) {
                if(numAssertsFailedCurrentTest == currentTest->m_expected_failures) {
                    failure_flags |= TestCaseFailureReason::FailedExactlyNumTimes;
                } else {
                    failure_flags |= TestCaseFailureReason::DidntFailExactlyNumTimes;
                }
            }

            bool ok_to_fail = (TestCaseFailureReason::ShouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::CouldHaveFailedAndDid & failure_flags) ||
                              (TestCaseFailureReason::FailedExactlyNumTimes & failure_flags);

            // if any subcase has failed - the whole test case has failed
            if(failure_flags && !ok_to_fail)
                numTestCasesFailed++;
        }